

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MouseInputHandler_glfw.cpp
# Opt level: O0

void anon_unknown.dwarf_521d2::_internalMouseButtonPressedCallback
               (GLFWwindow *window,int button,int action,int mods)

{
  bool bVar1;
  int iVar2;
  Application *this;
  reference psVar3;
  element_type *peVar4;
  element_type *this_00;
  shared_ptr<InputHandler> local_88 [2];
  undefined1 local_68 [8];
  shared_ptr<InputHandler> handler;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_> *__range1;
  Application *app;
  int mods_local;
  int action_local;
  int button_local;
  GLFWwindow *window_local;
  
  this = (Application *)glfwGetWindowUserPointer(window);
  Application::inputHandlers
            ((vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
              *)&__begin1,this);
  __end1 = std::
           vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::
           begin((vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
                  *)&__begin1);
  handler.super___shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::
       end((vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_> *
           )&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<InputHandler>_*,_std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>_>
                                *)&handler.
                                   super___shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) break;
    psVar3 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<InputHandler>_*,_std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<InputHandler>::shared_ptr((shared_ptr<InputHandler> *)local_68,psVar3);
    peVar4 = std::__shared_ptr_access<InputHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
    iVar2 = (**peVar4->_vptr_InputHandler)();
    if (iVar2 == 2) {
      std::dynamic_pointer_cast<MouseInputHandler,InputHandler>(local_88);
      this_00 = std::
                __shared_ptr_access<MouseInputHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<MouseInputHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_88);
      MouseInputHandler::mouseButtonPressed(this_00,button,action,mods);
      std::shared_ptr<MouseInputHandler>::~shared_ptr((shared_ptr<MouseInputHandler> *)local_88);
    }
    std::shared_ptr<InputHandler>::~shared_ptr((shared_ptr<InputHandler> *)local_68);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<InputHandler>_*,_std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::
  ~vector((vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_> *)
          &__begin1);
  return;
}

Assistant:

void _internalMouseButtonPressedCallback(GLFWwindow* window, int button, int action, int mods) {
        Application* app = (Application*)glfwGetWindowUserPointer(window);
        for (auto handler : app->inputHandlers()) {
            if (handler->type() == InputType::Mouse) {
                std::dynamic_pointer_cast<MouseInputHandler>(handler)->mouseButtonPressed(button, action, mods);
            }
        }
    }